

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_basics<vector_realloc<unsigned_long,16u>>(void)

{
  ostream *this;
  size_t sVar1;
  unsigned_long uVar2;
  uint local_c4;
  ulong uStack_c0;
  uint i_6;
  uint local_b8;
  uint local_b4;
  uint i_5;
  uint i_4;
  uint local_a8;
  uint local_a4;
  uint i_3;
  uint i_2;
  uint local_98;
  undefined4 local_94;
  uint i_1;
  uint N_1;
  vector_realloc<unsigned_long,_16U> v_3;
  uint local_70;
  uint i;
  uint N;
  vector_realloc<unsigned_long,_16U> v_2;
  undefined1 local_48 [8];
  vector_realloc<unsigned_long,_16U> v_1;
  undefined1 local_20 [8];
  vector_realloc<unsigned_long,_16U> v;
  
  this = std::operator<<((ostream *)&std::cerr,
                         "void test_basics() [Container = vector_realloc<unsigned long>]");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  vector_realloc<unsigned_long,_16U>::vector_realloc((vector_realloc<unsigned_long,_16U> *)local_20)
  ;
  sVar1 = vector_realloc<unsigned_long,_16U>::size((vector_realloc<unsigned_long,_16U> *)local_20);
  if (sVar1 != 0) {
    __assert_fail("v.size()==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                  ,0x1f,"void test_basics() [Container = vector_realloc<unsigned long>]");
  }
  vector_realloc<unsigned_long,_16U>::~vector_realloc
            ((vector_realloc<unsigned_long,_16U> *)local_20);
  vector_realloc<unsigned_long,_16U>::vector_realloc((vector_realloc<unsigned_long,_16U> *)local_48)
  ;
  v_2._capacity = 1;
  vector_realloc<unsigned_long,_16U>::push_back
            ((vector_realloc<unsigned_long,_16U> *)local_48,&v_2._capacity);
  sVar1 = vector_realloc<unsigned_long,_16U>::size((vector_realloc<unsigned_long,_16U> *)local_48);
  if (sVar1 == 1) {
    uVar2 = vector_realloc<unsigned_long,_16U>::operator[]
                      ((vector_realloc<unsigned_long,_16U> *)local_48,0);
    if (uVar2 != 1) {
      __assert_fail("v[0]==1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                    ,0x25,"void test_basics() [Container = vector_realloc<unsigned long>]");
    }
    vector_realloc<unsigned_long,_16U>::~vector_realloc
              ((vector_realloc<unsigned_long,_16U> *)local_48);
    vector_realloc<unsigned_long,_16U>::vector_realloc((vector_realloc<unsigned_long,_16U> *)&i);
    local_70 = 0;
    while( true ) {
      if (999999 < local_70) {
        sVar1 = vector_realloc<unsigned_long,_16U>::size((vector_realloc<unsigned_long,_16U> *)&i);
        if (sVar1 != 1000000) {
          __assert_fail("v.size()==N",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                        ,0x2f,"void test_basics() [Container = vector_realloc<unsigned long>]");
        }
        vector_realloc<unsigned_long,_16U>::~vector_realloc
                  ((vector_realloc<unsigned_long,_16U> *)&i);
        vector_realloc<unsigned_long,_16U>::vector_realloc
                  ((vector_realloc<unsigned_long,_16U> *)&i_1);
        local_94 = 1000000;
        for (local_98 = 0; local_98 < 1000000; local_98 = local_98 + 1) {
          _i_3 = (ulong)local_98;
          vector_realloc<unsigned_long,_16U>::push_back
                    ((vector_realloc<unsigned_long,_16U> *)&i_1,(unsigned_long *)&i_3);
        }
        local_a4 = 0;
        while( true ) {
          if (999999 < local_a4) {
            vector_realloc<unsigned_long,_16U>::clear((vector_realloc<unsigned_long,_16U> *)&i_1);
            sVar1 = vector_realloc<unsigned_long,_16U>::size
                              ((vector_realloc<unsigned_long,_16U> *)&i_1);
            if (sVar1 != 0) {
              __assert_fail("v.size()==0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                            ,0x37,"void test_basics() [Container = vector_realloc<unsigned long>]");
            }
            for (local_a8 = 0; local_a8 < 1000000; local_a8 = local_a8 + 1) {
              _i_5 = (ulong)local_a8;
              vector_realloc<unsigned_long,_16U>::push_back
                        ((vector_realloc<unsigned_long,_16U> *)&i_1,(unsigned_long *)&i_5);
            }
            local_b4 = 0;
            while( true ) {
              if (999999 < local_b4) {
                vector_realloc<unsigned_long,_16U>::clear
                          ((vector_realloc<unsigned_long,_16U> *)&i_1);
                sVar1 = vector_realloc<unsigned_long,_16U>::size
                                  ((vector_realloc<unsigned_long,_16U> *)&i_1);
                if (sVar1 != 0) {
                  __assert_fail("v.size()==0",
                                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                                ,0x3b,
                                "void test_basics() [Container = vector_realloc<unsigned long>]");
                }
                for (local_b8 = 0; local_b8 < 1000000; local_b8 = local_b8 + 1) {
                  uStack_c0 = (ulong)local_b8;
                  vector_realloc<unsigned_long,_16U>::push_back
                            ((vector_realloc<unsigned_long,_16U> *)&i_1,&stack0xffffffffffffff40);
                }
                local_c4 = 0;
                while( true ) {
                  if (999999 < local_c4) {
                    vector_realloc<unsigned_long,_16U>::clear
                              ((vector_realloc<unsigned_long,_16U> *)&i_1);
                    sVar1 = vector_realloc<unsigned_long,_16U>::size
                                      ((vector_realloc<unsigned_long,_16U> *)&i_1);
                    if (sVar1 == 0) {
                      vector_realloc<unsigned_long,_16U>::~vector_realloc
                                ((vector_realloc<unsigned_long,_16U> *)&i_1);
                      return;
                    }
                    __assert_fail("v.size()==0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                                  ,0x3f,
                                  "void test_basics() [Container = vector_realloc<unsigned long>]");
                  }
                  uVar2 = vector_realloc<unsigned_long,_16U>::operator[]
                                    ((vector_realloc<unsigned_long,_16U> *)&i_1,(ulong)local_c4);
                  if ((uint)uVar2 != local_c4) break;
                  local_c4 = local_c4 + 1;
                }
                __assert_fail("unsigned(v[i])==i",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                              ,0x3d,"void test_basics() [Container = vector_realloc<unsigned long>]"
                             );
              }
              uVar2 = vector_realloc<unsigned_long,_16U>::operator[]
                                ((vector_realloc<unsigned_long,_16U> *)&i_1,(ulong)local_b4);
              if ((uint)uVar2 != local_b4) break;
              local_b4 = local_b4 + 1;
            }
            __assert_fail("unsigned(v[i])==i",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                          ,0x39,"void test_basics() [Container = vector_realloc<unsigned long>]");
          }
          uVar2 = vector_realloc<unsigned_long,_16U>::operator[]
                            ((vector_realloc<unsigned_long,_16U> *)&i_1,(ulong)local_a4);
          if ((uint)uVar2 != local_a4) break;
          local_a4 = local_a4 + 1;
        }
        __assert_fail("unsigned(v[i])==i",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                      ,0x35,"void test_basics() [Container = vector_realloc<unsigned long>]");
      }
      sVar1 = vector_realloc<unsigned_long,_16U>::size((vector_realloc<unsigned_long,_16U> *)&i);
      if (sVar1 != local_70) break;
      v_3._capacity = (size_t)local_70;
      vector_realloc<unsigned_long,_16U>::push_back
                ((vector_realloc<unsigned_long,_16U> *)&i,&v_3._capacity);
      uVar2 = vector_realloc<unsigned_long,_16U>::operator[]
                        ((vector_realloc<unsigned_long,_16U> *)&i,(ulong)local_70);
      if ((uint)uVar2 != local_70) {
        __assert_fail("unsigned(v[i])==i",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                      ,0x2d,"void test_basics() [Container = vector_realloc<unsigned long>]");
      }
      local_70 = local_70 + 1;
    }
    __assert_fail("v.size()==i",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                  ,0x2b,"void test_basics() [Container = vector_realloc<unsigned long>]");
  }
  __assert_fail("v.size()==1",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/main.cpp"
                ,0x24,"void test_basics() [Container = vector_realloc<unsigned long>]");
}

Assistant:

void test_basics()
{
	std::cerr<<__PRETTY_FUNCTION__<<std::endl;
	{
		Container v;
		assert(v.size()==0);
	}
	{
		Container v;
		v.push_back(1);
		assert(v.size()==1);
		assert(v[0]==1);
	}
	{
		Container v;
		const unsigned N=1000000;
		for (unsigned i=0; i < N; ++i) {
			assert(v.size()==i);
			v.push_back(i);
			assert(unsigned(v[i])==i);
		}
		assert(v.size()==N);
	}
	{
		Container v;
		const unsigned N=1000000;
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
		for (unsigned i=0; i < N; ++i) v.push_back(i);
		for (unsigned i=0; i < N; ++i) assert(unsigned(v[i])==i);
		v.clear();
		assert(v.size()==0);
	}
}